

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

Object * resolveCall(Object *__return_storage_ptr__,Call c,Environment *env)

{
  char *identifer;
  Object value;
  int iVar1;
  Environment *env_00;
  Instance *pIVar2;
  long lVar3;
  Container r;
  Object local_f0;
  Object callee;
  Object local_70;
  
  iVar1 = strcmp(c.identifer,"Main");
  if ((iVar1 != 0) && (env_get(&callee,c.identifer,c.line,env), callee.type != OBJECT_ROUTINE)) {
    env_container_get(&r,c.identifer,c.line,globalEnv);
    if (r.arity == c.argCount) {
      env_00 = env_new(globalEnv);
      for (lVar3 = 0; lVar3 < r.arity; lVar3 = lVar3 + 1) {
        identifer = r.arguments[lVar3];
        resolveExpression(&local_f0,c.arguments[lVar3],env);
        value.field_1.instance = local_f0.field_1.instance;
        value.type = local_f0.type;
        value._4_4_ = local_f0._4_4_;
        value.field_1._8_8_ = local_f0.field_1._8_8_;
        value.field_1._16_8_ = local_f0.field_1._16_8_;
        value.field_1.routine.arguments = local_f0.field_1.routine.arguments;
        value.field_1._32_8_ = local_f0.field_1._32_8_;
        value.field_1.container.constructor.statements =
             local_f0.field_1.container.constructor.statements;
        value.field_1.routine.code.statements = local_f0.field_1.routine.code.statements;
        env_put(identifer,c.line,value,env_00);
      }
      executeBlock(&local_70,r.constructor,env_00);
      __return_storage_ptr__->type = OBJECT_INSTANCE;
      pIVar2 = (Instance *)malloc(0x20);
      pIVar2->name = r.name;
      pIVar2->environment = env_00;
      pIVar2->refCount = 0;
      (__return_storage_ptr__->field_1).instance = pIVar2;
      instanceCount = instanceCount + 1;
      pIVar2->insCount = instanceCount;
      pIVar2->fromReturn = 0;
      return __return_storage_ptr__;
    }
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Argument count mismatch for container %s! Expected : %d Received %d!\x1b[0m"
           ,(ulong)(uint)c.line,c.identifer,(ulong)(uint)r.arity,(ulong)(uint)c.argCount);
    stop();
  }
  resolveRoutineCall(__return_storage_ptr__,c,env);
  return __return_storage_ptr__;
}

Assistant:

static Object resolveCall(Call c, Environment *env){
    if(strcmp(c.identifer, "Main") == 0)
        return resolveRoutineCall(c, env);

    Object callee = env_get(c.identifer, c.line, env);
    if(callee.type == OBJECT_ROUTINE)
        return resolveRoutineCall(c, env);
    else
        return resolveContainerCall(c, env);
}